

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O3

void __thiscall
Js::ByteCodeWriter::SlotI2
          (ByteCodeWriter *this,OpCode op,RegSlot value,uint32 slotId1,uint32 slotId2,
          ProfileId profileId)

{
  code *pcVar1;
  uint32 slotId1_00;
  bool bVar2;
  RegSlot value_00;
  undefined4 *puVar3;
  FunctionBody *this_00;
  uint32 slotId2_00;
  uint32 local_4c;
  uint32 local_48;
  RegSlot local_44;
  uint32 local_40;
  ProfileId local_3a;
  uint32 local_38;
  ProfileId profileId_local;
  OpCode op_local;
  
  local_40 = slotId1;
  local_3a = profileId;
  local_38 = slotId2;
  profileId_local = op;
  CheckOpen(this);
  CheckOp(this,op,(OpLayoutType)0x3f);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(op);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x6e8,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) goto LAB_0089212c;
    *puVar3 = 0;
  }
  if (value != 0xffffffff) {
    this_00 = this->m_functionWrite;
    if (this_00 == (FunctionBody *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
      if (!bVar2) goto LAB_0089212c;
      *puVar3 = 0;
      this_00 = this->m_functionWrite;
    }
    value_00 = FunctionBody::MapRegSlot(this_00,value);
    if ((((op - 0x136 < 0xb) && ((0x501U >> (op - 0x136 & 0x1f) & 1) != 0)) || (op == LdInnerSlot))
       || (op == LdEnvSlot)) {
      bVar2 = DynamicProfileInfo::IsEnabled(AggressiveIntTypeSpecPhase,this->m_functionWrite);
      if (bVar2) {
        bVar2 = profileId == 0xffff;
      }
      else {
        bVar2 = DynamicProfileInfo::IsEnabled(FloatTypeSpecPhase,this->m_functionWrite);
        bVar2 = !bVar2 || profileId == 0xffff;
      }
      slotId2_00 = local_38;
      if (!bVar2) {
        OpCodeUtil::ConvertNonCallOpToProfiled(&profileId_local);
        op = profileId_local;
      }
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x6fc,"(false)",
                                  "The specified OpCode is not intended for slot access");
      if (!bVar2) goto LAB_0089212c;
      *puVar3 = 0;
      slotId2_00 = local_38;
    }
    slotId1_00 = local_40;
    bVar2 = TryWriteElementSlotI2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                      (this,op,value_00,local_40,slotId2_00);
    if (!bVar2) {
      bVar2 = TryWriteElementSlotI2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                        (this,profileId_local,value_00,slotId1_00,slotId2_00);
      if (!bVar2) {
        local_4c = slotId1_00;
        local_48 = slotId2_00;
        local_44 = value_00;
        Data::EncodeT<(Js::LayoutSize)2>(&this->m_byteCodeData,profileId_local,this);
        Data::Write(&this->m_byteCodeData,&local_4c,0xc);
      }
    }
    bVar2 = OpCodeAttr::IsProfiledOp(profileId_local);
    if (bVar2) {
      Data::Write(&this->m_byteCodeData,&local_3a,2);
    }
    return;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar3 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                              ,0x146,"(registerID != Js::Constants::NoRegister)","bad register");
  if (bVar2) {
    *puVar3 = 0;
    Throw::InternalError();
  }
LAB_0089212c:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void ByteCodeWriter::SlotI2(OpCode op, RegSlot value, uint32 slotId1, uint32 slotId2, ProfileId profileId)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::ElementSlotI2);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        value = ConsumeReg(value);

        switch (op)
        {
            case OpCode::LdInnerSlot:
            case OpCode::LdInnerObjSlot:
            case OpCode::LdEnvSlot:
            case OpCode::LdEnvObjSlot:
            case OpCode::LdModuleSlot:
                if ((DoDynamicProfileOpcode(AggressiveIntTypeSpecPhase) || DoDynamicProfileOpcode(FloatTypeSpecPhase)) &&
                    profileId != Constants::NoProfileId)
                {
                    OpCodeUtil::ConvertNonCallOpToProfiled(op);
                }
                break;

            default:
            {
                AssertMsg(false, "The specified OpCode is not intended for slot access");
                break;
            }
        }

        MULTISIZE_LAYOUT_WRITE(ElementSlotI2, op, value, slotId1, slotId2);
        if (OpCodeAttr::IsProfiledOp(op))
        {
            m_byteCodeData.Encode(&profileId, sizeof(Js::ProfileId));
        }
    }